

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O1

bool DeploymentEnabled<Consensus::BuriedDeployment>
               (ChainstateManager *chainman,BuriedDeployment dep)

{
  CChainParams *pCVar1;
  int iVar2;
  undefined6 in_register_00000032;
  long in_FS_OFFSET;
  
  if (-0x7ffc < (int)CONCAT62(in_register_00000032,dep)) {
    __assert_fail("Consensus::ValidDeployment(dep)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/deploymentstatus.h"
                  ,0x2a,
                  "bool DeploymentEnabled(const Consensus::Params &, Consensus::BuriedDeployment)");
  }
  if ((int)dep + 0x8000U < 5) {
    pCVar1 = (chainman->m_options).chainparams;
    switch((int)dep) {
    case -0x8000:
      iVar2 = (pCVar1->consensus).BIP34Height;
      break;
    case -0x7fff:
      iVar2 = (pCVar1->consensus).BIP65Height;
      break;
    case -0x7ffe:
      iVar2 = (pCVar1->consensus).BIP66Height;
      break;
    case -0x7ffd:
      iVar2 = (pCVar1->consensus).CSVHeight;
      break;
    case -0x7ffc:
      iVar2 = (pCVar1->consensus).SegwitHeight;
    }
  }
  else {
    iVar2 = 0x7fffffff;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return iVar2 != 0x7fffffff;
  }
  __stack_chk_fail();
}

Assistant:

bool DeploymentEnabled(const ChainstateManager& chainman, DEP dep)
{
    return DeploymentEnabled(chainman.GetConsensus(), dep);
}